

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

DefaultCaseItemSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::DefaultCaseItemSyntax,slang::syntax::DefaultCaseItemSyntax_const&>
          (BumpAllocator *this,DefaultCaseItemSyntax *args)

{
  SyntaxNode *pSVar1;
  SyntaxNode *pSVar2;
  Info *pIVar3;
  Info *pIVar4;
  SyntaxNode *pSVar5;
  undefined4 uVar6;
  TokenKind TVar7;
  undefined1 uVar8;
  NumericTokenFlags NVar9;
  uint32_t uVar10;
  TokenKind TVar11;
  undefined1 uVar12;
  NumericTokenFlags NVar13;
  uint32_t uVar14;
  DefaultCaseItemSyntax *pDVar15;
  
  pDVar15 = (DefaultCaseItemSyntax *)allocate(this,0x40,8);
  uVar6 = *(undefined4 *)&(args->super_CaseItemSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_CaseItemSyntax).super_SyntaxNode.parent;
  pSVar2 = (args->super_CaseItemSyntax).super_SyntaxNode.previewNode;
  TVar7 = (args->defaultKeyword).kind;
  uVar8 = (args->defaultKeyword).field_0x2;
  NVar9.raw = (args->defaultKeyword).numFlags.raw;
  uVar10 = (args->defaultKeyword).rawLen;
  pIVar3 = (args->defaultKeyword).info;
  TVar11 = (args->colon).kind;
  uVar12 = (args->colon).field_0x2;
  NVar13.raw = (args->colon).numFlags.raw;
  uVar14 = (args->colon).rawLen;
  pIVar4 = (args->colon).info;
  pSVar5 = (args->clause).ptr;
  (pDVar15->super_CaseItemSyntax).super_SyntaxNode.kind =
       (args->super_CaseItemSyntax).super_SyntaxNode.kind;
  *(undefined4 *)&(pDVar15->super_CaseItemSyntax).super_SyntaxNode.field_0x4 = uVar6;
  (pDVar15->super_CaseItemSyntax).super_SyntaxNode.parent = pSVar1;
  (pDVar15->super_CaseItemSyntax).super_SyntaxNode.previewNode = pSVar2;
  (pDVar15->defaultKeyword).kind = TVar7;
  (pDVar15->defaultKeyword).field_0x2 = uVar8;
  (pDVar15->defaultKeyword).numFlags = (NumericTokenFlags)NVar9.raw;
  (pDVar15->defaultKeyword).rawLen = uVar10;
  (pDVar15->defaultKeyword).info = pIVar3;
  (pDVar15->colon).kind = TVar11;
  (pDVar15->colon).field_0x2 = uVar12;
  (pDVar15->colon).numFlags = (NumericTokenFlags)NVar13.raw;
  (pDVar15->colon).rawLen = uVar14;
  (pDVar15->colon).info = pIVar4;
  (pDVar15->clause).ptr = pSVar5;
  return pDVar15;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }